

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O2

UINT8 SndEmu_Start(UINT8 deviceID,DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DEF *pDVar1;
  UINT8 UVar2;
  DEV_DEF **ppDVar3;
  
  ppDVar3 = SndEmu_GetDevDefList(deviceID);
  if (ppDVar3 == (DEV_DEF **)0x0) {
    UVar2 = 0xf0;
  }
  else {
    for (; pDVar1 = *ppDVar3, pDVar1 != (DEV_DEF *)0x0; ppDVar3 = ppDVar3 + 1) {
      if ((cfg->emuCore == 0) || (pDVar1->coreID == cfg->emuCore)) {
        UVar2 = (*pDVar1->Start)(cfg,retDevInf);
        if (UVar2 != '\0') {
          return UVar2;
        }
        (*(*ppDVar3)->Reset)(retDevInf->dataPtr);
        return '\0';
      }
    }
    UVar2 = 0xf8;
  }
  return UVar2;
}

Assistant:

UINT8 SndEmu_Start(UINT8 deviceID, const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	const DEV_DEF** diList;
	const DEV_DEF** curDIL;
	
	diList = SndEmu_GetDevDefList(deviceID);
	if (diList == NULL)
		return EERR_UNK_DEVICE;
	
	for (curDIL = diList; *curDIL != NULL; curDIL ++)
	{
		// emuCore == 0 -> use default
		if (! cfg->emuCore || (*curDIL)->coreID == cfg->emuCore)
		{
			UINT8 retVal;
			
			retVal = (*curDIL)->Start(cfg, retDevInf);
			if (! retVal)	// if initialization is successful, reset the chip to ensure a clean state
				(*curDIL)->Reset(retDevInf->dataPtr);
			return retVal;
		}
	}
	return EERR_NOT_FOUND;
}